

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

int SUNSparseMatrix_Realloc(SUNMatrix A)

{
  int iVar1;
  void *pvVar2;
  SUNMatrix_ID SVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  
  SVar3 = SUNMatGetID(A);
  iVar4 = -0x2bd;
  if (SVar3 == SUNMATRIX_SPARSE) {
    pvVar2 = A->content;
    iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x28) + (long)*(int *)((long)pvVar2 + 0xc) * 4);
    lVar6 = (long)iVar1;
    if (-1 < lVar6) {
      pvVar5 = realloc(*(void **)((long)pvVar2 + 0x20),lVar6 * 4);
      pvVar2 = A->content;
      *(void **)((long)pvVar2 + 0x20) = pvVar5;
      pvVar5 = realloc(*(void **)((long)pvVar2 + 0x10),lVar6 << 3);
      pvVar2 = A->content;
      *(void **)((long)pvVar2 + 0x10) = pvVar5;
      *(int *)((long)pvVar2 + 8) = iVar1;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int SUNSparseMatrix_Realloc(SUNMatrix A)
{
  sunindextype nzmax;

  /* check for valid matrix type */
  if (SUNMatGetID(A) != SUNMATRIX_SPARSE)
    return SUNMAT_ILL_INPUT;

  /* get total number of nonzeros (return with failure if illegal) */
  nzmax = (SM_INDEXPTRS_S(A))[SM_NP_S(A)];
  if (nzmax < 0) return SUNMAT_ILL_INPUT;

  /* perform reallocation */
  SM_INDEXVALS_S(A) = (sunindextype *) realloc(SM_INDEXVALS_S(A), nzmax*sizeof(sunindextype));
  SM_DATA_S(A) = (realtype *) realloc(SM_DATA_S(A), nzmax*sizeof(realtype));
  SM_NNZ_S(A) = nzmax;

  return SUNMAT_SUCCESS;
}